

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVodeGetB(void *cvode_mem,int which,sunrealtype *tret,N_Vector yB)

{
  int line;
  int error_code;
  char *msgfmt;
  int *piVar1;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x671;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    error_code = -0x65;
    line = 0x679;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      for (piVar1 = (int *)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
          (piVar1 = *(int **)piVar1, piVar1 != (int *)0x0 && (*piVar1 != which));
          piVar1 = piVar1 + 0x1e) {
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)(piVar1 + 0x1c),yB);
      *tret = *(sunrealtype *)(piVar1 + 0x1a);
      return 0;
    }
    msgfmt = "Illegal value for which.";
    error_code = -0x16;
    line = 0x682;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetB(void* cvode_mem, int which, sunrealtype* tret, N_Vector yB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }

  ca_mem = cv_mem->cv_adj_mem;

  /* Check the value of which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  N_VScale(ONE, cvB_mem->cv_y, yB);
  *tret = cvB_mem->cv_tout;

  return (CV_SUCCESS);
}